

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImageLoader.cpp
# Opt level: O0

bool __thiscall
sf::priv::ImageLoader::loadImageFromStream
          (ImageLoader *this,InputStream *stream,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *pixels,Vector2u *size)

{
  stbi_uc *psVar1;
  ostream *poVar2;
  char *pcVar3;
  undefined4 *in_RCX;
  long *in_RSI;
  uchar *ptr;
  int channels;
  int height;
  int width;
  stbi_io_callbacks callbacks;
  int *in_stack_00000070;
  int *in_stack_00000078;
  int *in_stack_00000080;
  void *in_stack_00000088;
  stbi_io_callbacks *in_stack_00000090;
  bool local_1;
  
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::clear
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x1d64d2);
  (**(code **)(*in_RSI + 0x18))(in_RSI,0);
  psVar1 = stbi_load_from_callbacks
                     (in_stack_00000090,in_stack_00000088,in_stack_00000080,in_stack_00000078,
                      in_stack_00000070,this._4_4_);
  if (psVar1 == (stbi_uc *)0x0) {
    poVar2 = err();
    poVar2 = std::operator<<(poVar2,"Failed to load image from stream. Reason: ");
    pcVar3 = stbi_failure_reason();
    poVar2 = std::operator<<(poVar2,pcVar3);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  else {
    *in_RCX = 0;
    in_RCX[1] = 0;
    stbi_image_free((void *)0x1d65d3);
  }
  local_1 = psVar1 != (stbi_uc *)0x0;
  return local_1;
}

Assistant:

bool ImageLoader::loadImageFromStream(InputStream& stream, std::vector<Uint8>& pixels, Vector2u& size)
{
    // Clear the array (just in case)
    pixels.clear();

    // Make sure that the stream's reading position is at the beginning
    stream.seek(0);

    // Setup the stb_image callbacks
    stbi_io_callbacks callbacks;
    callbacks.read = &read;
    callbacks.skip = &skip;
    callbacks.eof  = &eof;

    // Load the image and get a pointer to the pixels in memory
    int width = 0;
    int height = 0;
    int channels = 0;
    unsigned char* ptr = stbi_load_from_callbacks(&callbacks, &stream, &width, &height, &channels, STBI_rgb_alpha);

    if (ptr)
    {
        // Assign the image properties
        size.x = static_cast<unsigned int>(width);
        size.y = static_cast<unsigned int>(height);

        if (width && height)
        {
            // Copy the loaded pixels to the pixel buffer
            pixels.resize(static_cast<std::size_t>(width * height * 4));
            memcpy(&pixels[0], ptr, pixels.size());
        }

        // Free the loaded pixels (they are now in our own pixel buffer)
        stbi_image_free(ptr);

        return true;
    }
    else
    {
        // Error, failed to load the image
        err() << "Failed to load image from stream. Reason: " << stbi_failure_reason() << std::endl;

        return false;
    }
}